

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_upto_post_snapshot_test(void)

{
  fdb_status fVar1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  uint64_t num_markers;
  fdb_kvs_info kvs_info;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_status status;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  uint64_t *in_stack_00000e68;
  fdb_snapshot_info_t **in_stack_00000e70;
  fdb_file_handle *in_stack_00000e78;
  undefined2 in_stack_fffffffffffffd08;
  undefined2 uVar2;
  undefined2 in_stack_fffffffffffffd0a;
  undefined2 uVar3;
  undefined4 in_stack_fffffffffffffd0c;
  fdb_file_handle *in_stack_fffffffffffffd10;
  fdb_iterator *in_stack_fffffffffffffd18;
  size_t in_stack_fffffffffffffd28;
  void *in_stack_fffffffffffffd30;
  size_t in_stack_fffffffffffffd38;
  void *in_stack_fffffffffffffd40;
  fdb_kvs_handle *in_stack_fffffffffffffd48;
  fdb_doc **in_stack_fffffffffffffd80;
  fdb_iterator *in_stack_fffffffffffffd88;
  char local_1c8 [56];
  fdb_kvs_info *in_stack_fffffffffffffe70;
  fdb_kvs_handle *in_stack_fffffffffffffe78;
  fdb_config *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  fdb_file_handle **in_stack_ffffffffffffff38;
  long local_b8;
  fdb_iterator *local_88;
  fdb_status local_7c;
  fdb_kvs_handle *local_70;
  fdb_iterator *local_68;
  int local_58;
  uint local_54;
  fdb_seqnum_t in_stack_ffffffffffffffb0;
  fdb_kvs_handle **in_stack_ffffffffffffffb8;
  fdb_kvs_handle *in_stack_ffffffffffffffc0;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  local_58 = system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fdb_open(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  fdb_kvs_open_default
            (in_stack_fffffffffffffd10,
             (fdb_kvs_handle **)
             CONCAT44(in_stack_fffffffffffffd0c,
                      CONCAT22(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08)),
             (fdb_kvs_config *)0x113380);
  local_54 = 0;
  do {
    if (9 < (int)local_54) {
      local_7c = fdb_get_kvs_info(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xac5);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xac5,"void compact_upto_post_snapshot_test()");
        }
      }
      if (local_b8 != 10) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xac6);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_b8 != 10) {
          __assert_fail("kvs_info.last_seqnum == 10",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xac6,"void compact_upto_post_snapshot_test()");
        }
      }
      local_7c = fdb_snapshot_open(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                   in_stack_ffffffffffffffb0);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xaca);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xaca,"void compact_upto_post_snapshot_test()");
        }
      }
      local_7c = fdb_get_kvs_info(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xace);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xace,"void compact_upto_post_snapshot_test()");
        }
      }
      if (local_b8 != 5) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xacf);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_b8 != 5) {
          __assert_fail("kvs_info.last_seqnum == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xacf,"void compact_upto_post_snapshot_test()");
        }
      }
      local_7c = fdb_get_all_snap_markers(in_stack_00000e78,in_stack_00000e70,in_stack_00000e68);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xad5);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xad5,"void compact_upto_post_snapshot_test()");
        }
      }
      local_7c = fdb_compact_upto(in_stack_fffffffffffffd10,
                                  (char *)CONCAT44(in_stack_fffffffffffffd0c,
                                                   CONCAT22(in_stack_fffffffffffffd0a,
                                                            in_stack_fffffffffffffd08)),0x11378c);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xad7);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xad7,"void compact_upto_post_snapshot_test()");
        }
      }
      local_7c = fdb_free_snap_markers
                           ((fdb_snapshot_info_t *)in_stack_fffffffffffffd18,
                            (uint64_t)in_stack_fffffffffffffd10);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xad9);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xad9,"void compact_upto_post_snapshot_test()");
        }
      }
      local_7c = fdb_get_kvs_info(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xadd);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xadd,"void compact_upto_post_snapshot_test()");
        }
      }
      if (local_b8 != 10) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xade);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_b8 != 10) {
          __assert_fail("kvs_info.last_seqnum == 10",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xade,"void compact_upto_post_snapshot_test()");
        }
      }
      local_7c = fdb_get_kvs_info(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xae0);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xae0,"void compact_upto_post_snapshot_test()");
        }
      }
      if (local_b8 != 5) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xae1);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_b8 != 5) {
          __assert_fail("kvs_info.last_seqnum == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xae1,"void compact_upto_post_snapshot_test()");
        }
      }
      uVar2 = 0;
      uVar3 = 0;
      local_7c = fdb_iterator_init(local_70,&local_88,(void *)0x0,0,(void *)0x0,0,0);
      if (local_7c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xae7);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_7c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xae7,"void compact_upto_post_snapshot_test()");
        }
      }
      local_54 = 0;
      do {
        local_7c = fdb_iterator_get(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        if (local_7c != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaeb);
          compact_upto_post_snapshot_test::__test_pass = 0;
          if (local_7c != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xaeb,"void compact_upto_post_snapshot_test()");
          }
        }
        fdb_doc_free((fdb_doc *)0x113b7a);
        local_54 = local_54 + 1;
        local_7c = fdb_get_kvs_info(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        if (local_7c != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaf2);
          compact_upto_post_snapshot_test::__test_pass = 0;
          if (local_7c != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xaf2,"void compact_upto_post_snapshot_test()");
          }
        }
        if (local_b8 != 10) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaf3);
          compact_upto_post_snapshot_test::__test_pass = 0;
          if (local_b8 != 10) {
            __assert_fail("kvs_info.last_seqnum == 10",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xaf3,"void compact_upto_post_snapshot_test()");
          }
        }
        local_7c = fdb_get_kvs_info(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        if (local_7c != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaf5);
          compact_upto_post_snapshot_test::__test_pass = 0;
          if (local_7c != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xaf5,"void compact_upto_post_snapshot_test()");
          }
        }
        if (local_b8 != 5) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaf6);
          compact_upto_post_snapshot_test::__test_pass = 0;
          if (local_b8 != 5) {
            __assert_fail("kvs_info.last_seqnum == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xaf6,"void compact_upto_post_snapshot_test()");
          }
        }
        fVar1 = fdb_iterator_next((fdb_iterator *)
                                  CONCAT44(in_stack_fffffffffffffd0c,CONCAT22(uVar3,uVar2)));
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      if (local_54 != 5) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xaf9);
        compact_upto_post_snapshot_test::__test_pass = 0;
        if (local_54 != 5) {
          __assert_fail("i == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xaf9,"void compact_upto_post_snapshot_test()");
        }
      }
      fdb_iterator_close(in_stack_fffffffffffffd18);
      fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffd0c,CONCAT22(uVar3,uVar2)));
      fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffd0c,CONCAT22(uVar3,uVar2)));
      fdb_shutdown();
      memleak_end();
      if (compact_upto_post_snapshot_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","compact upto post snapshot test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","compact upto post snapshot test");
      }
      return;
    }
    sprintf(local_1c8,"key%d",(ulong)local_54);
    in_stack_fffffffffffffd18 = local_68;
    strlen(local_1c8);
    local_7c = fdb_set_kv(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                          in_stack_fffffffffffffd28);
    if (local_7c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xabf);
      compact_upto_post_snapshot_test::__test_pass = 0;
      if (local_7c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xabf,"void compact_upto_post_snapshot_test()");
      }
    }
    fdb_commit((fdb_file_handle *)
               CONCAT44(in_stack_fffffffffffffd0c,
                        CONCAT22(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08)),'\0');
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void compact_upto_post_snapshot_test()
{
    TEST_INIT();
    memleak_start();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_doc *rdoc = NULL;
    fdb_kvs_info kvs_info;
    uint64_t num_markers;
    char keybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    // prevent block reusing to keep snapshots
    fconfig.block_reusing_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    }

    // check  db info
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 10);

    // open snapshot at seqnum 5
    status = fdb_snapshot_open(db, &snap_db, 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snap info
    status = fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 5);


    // compact upto
    status = fdb_get_all_snap_markers(dbfile, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_compact_upto(dbfile, NULL, markers[5].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check db and snap info
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 10);
    status = fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 5);


    // iterate over snapshot
    status = fdb_iterator_init(snap_db,
                               &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;

        // check db and snap info
        status = fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(kvs_info.last_seqnum == 10);
        status = fdb_get_kvs_info(snap_db, &kvs_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(kvs_info.last_seqnum == 5);
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(i == 5);

    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact upto post snapshot test");
}